

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_get_encoded_list_size(AMQP_VALUE *items,uint32_t count,uint32_t *encoded_size)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  size_t item_size;
  
  if (encoded_size == (uint32_t *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0xea4;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_encoded_list_size",0xea3,1,"Bad arguments: encoded_size = %p",0);
    }
  }
  else {
    *encoded_size = 0;
    iVar3 = 0;
    for (uVar5 = 0; count != uVar5; uVar5 = uVar5 + 1) {
      iVar1 = amqpvalue_get_encoded_size(items[uVar5],&item_size);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0xec0;
        }
        pcVar4 = "Could not get encoded size for element %u of the list";
        iVar3 = 0xeb0;
LAB_0010b276:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                  ,"amqpvalue_get_encoded_list_size",iVar3,1,pcVar4);
        return 0xec0;
      }
      if ((item_size >> 0x20 != 0) || (CARRY4((uint)item_size,*encoded_size))) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0xec0;
        }
        pcVar4 = "Overflow in list size computation";
        iVar3 = 0xeb7;
        goto LAB_0010b276;
      }
      *encoded_size = (uint)item_size + *encoded_size;
    }
  }
  return iVar3;
}

Assistant:

static int amqpvalue_get_encoded_list_size(AMQP_VALUE* items, uint32_t count, uint32_t* encoded_size)
{
    int result;
    size_t i;

    if (encoded_size == NULL)
    {
        LogError("Bad arguments: encoded_size = %p", encoded_size);
        result = MU_FAILURE;
    }
    else
    {
        *encoded_size = 0;

        /* Get the size of all items in the list */
        for (i = 0; i < count; i++)
        {
            size_t item_size;
            if (amqpvalue_get_encoded_size(items[i], &item_size) != 0)
            {
                LogError("Could not get encoded size for element %u of the list", (unsigned int)i);
                break;
            }

            if ((item_size > UINT32_MAX) ||
                *encoded_size + (uint32_t)item_size < *encoded_size)
            {
                LogError("Overflow in list size computation");
                break;
            }

            *encoded_size = (uint32_t)(*encoded_size + item_size);
        }

        if (i < count)
        {
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }
    }
    return result;
}